

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::InitialTimeZoneRule::isEquivalentTo(InitialTimeZoneRule *this,TimeZoneRule *other)

{
  bool bVar1;
  UBool UVar2;
  TimeZoneRule *other_local;
  InitialTimeZoneRule *this_local;
  
  if (&this->super_TimeZoneRule == other) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (InitialTimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if ((!bVar1) &&
       (UVar2 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar2 != '\0')) {
      return '\x01';
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
InitialTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    return TRUE;
}